

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O0

void __thiscall
Assimp::STEP::
InternGenericConvertList<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_1UL,_0UL>
::operator()(InternGenericConvertList<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_1UL,_0UL>
             *this,ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_1UL,_0UL>
                   *out,shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *inp_base,DB *db)

{
  pointer psVar1;
  shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *psVar2;
  element_type *peVar3;
  TypeError *this_00;
  size_t sVar4;
  Logger *this_01;
  pointer psVar5;
  reference a;
  LIST *local_e8;
  TypeError *t;
  Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem> local_78;
  pointer local_70;
  size_t i;
  allocator local_51;
  string local_50;
  LIST *local_30;
  LIST *inp;
  DB *db_local;
  shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *inp_base_local;
  ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_1UL,_0UL> *out_local;
  InternGenericConvertList<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_1UL,_0UL>
  *this_local;
  
  inp = (LIST *)db;
  db_local = (DB *)inp_base;
  inp_base_local = (shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)out;
  out_local = (ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_1UL,_0UL>
               *)this;
  peVar3 = std::__shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>::get
                     (&inp_base->
                       super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                     );
  if (peVar3 == (element_type *)0x0) {
    local_e8 = (LIST *)0x0;
  }
  else {
    local_e8 = (LIST *)__dynamic_cast(peVar3,&EXPRESS::DataType::typeinfo,&EXPRESS::LIST::typeinfo,0
                                     );
  }
  local_30 = local_e8;
  if (local_e8 == (LIST *)0x0) {
    i._3_1_ = 1;
    this_00 = (TypeError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_50,"type error reading aggregate",&local_51);
    TypeError::TypeError(this_00,&local_50,0xffffffffffffffff,0xffffffffffffffff);
    i._3_1_ = 0;
    __cxa_throw(this_00,&TypeError::typeinfo,TypeError::~TypeError);
  }
  sVar4 = EXPRESS::LIST::GetSize(local_e8);
  if (sVar4 == 0) {
    this_01 = DefaultLogger::get();
    Logger::warn(this_01,"too few aggregate elements");
  }
  psVar2 = inp_base_local;
  sVar4 = EXPRESS::LIST::GetSize(local_30);
  std::
  vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
  ::reserve((vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
             *)psVar2,sVar4);
  local_70 = (pointer)0x0;
  while( true ) {
    psVar1 = local_70;
    psVar5 = (pointer)EXPRESS::LIST::GetSize(local_30);
    psVar2 = inp_base_local;
    if (psVar5 <= psVar1) break;
    Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>::Lazy(&local_78,(LazyObject *)0x0);
    std::
    vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
    ::push_back((vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
                 *)psVar2,&local_78);
    a = std::
        vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
        ::back((vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
                *)inp_base_local);
    EXPRESS::LIST::operator[]((LIST *)&t,(size_t)local_30);
    GenericConvert<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>>
              (a,(shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)&t,(DB *)inp);
    std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>::~shared_ptr
              ((shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)&t);
    local_70 = (pointer)((long)&(local_70->
                                super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                                )._M_ptr + 1);
  }
  return;
}

Assistant:

void operator()(ListOf<T, min_cnt, max_cnt>& out, const std::shared_ptr< const EXPRESS::DataType >& inp_base, const STEP::DB& db) {

            const EXPRESS::LIST* inp = dynamic_cast<const EXPRESS::LIST*>(inp_base.get());
            if (!inp) {
                throw TypeError("type error reading aggregate");
            }

            // XXX is this really how the EXPRESS notation ([?:3],[1:3]) is intended?
            if (max_cnt && inp->GetSize() > max_cnt) {
                ASSIMP_LOG_WARN("too many aggregate elements");
            }
            else if (inp->GetSize() < min_cnt) {
                ASSIMP_LOG_WARN("too few aggregate elements");
            }

            out.reserve(inp->GetSize());
            for(size_t i = 0; i < inp->GetSize(); ++i) {

                out.push_back( typename ListOf<T, min_cnt, max_cnt>::OutScalar() );
                try{
                    GenericConvert(out.back(),(*inp)[i], db);
                }
                catch(const TypeError& t) {
                    throw TypeError(t.what() +std::string(" of aggregate"));
                }
            }
        }